

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void compileoptionusedFunc(sqlite3_context *context,int argc,sqlite3_value **argv)

{
  sqlite3_context *pCtx;
  undefined4 in_ESI;
  undefined8 in_RDI;
  int iVal;
  char *zOptName;
  undefined4 in_stack_fffffffffffffff0;
  
  iVal = (int)((ulong)in_RDI >> 0x20);
  pCtx = (sqlite3_context *)sqlite3_value_text((sqlite3_value *)0x222d92);
  if (pCtx != (sqlite3_context *)0x0) {
    sqlite3_compileoption_used((char *)CONCAT44(in_ESI,in_stack_fffffffffffffff0));
    sqlite3_result_int(pCtx,iVal);
  }
  return;
}

Assistant:

static void compileoptionusedFunc(
  sqlite3_context *context,
  int argc,
  sqlite3_value **argv
){
  const char *zOptName;
  assert( argc==1 );
  UNUSED_PARAMETER(argc);
  /* IMP: R-39564-36305 The sqlite_compileoption_used() SQL
  ** function is a wrapper around the sqlite3_compileoption_used() C/C++
  ** function.
  */
  if( (zOptName = (const char*)sqlite3_value_text(argv[0]))!=0 ){
    sqlite3_result_int(context, sqlite3_compileoption_used(zOptName));
  }
}